

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrPassthroughColorMapInterpolatedLutMETA *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  invalid_argument *this;
  string type_prefix;
  string weight_prefix;
  string targetcolorlut_prefix;
  string sourcecolorlut_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string local_4b8;
  ostringstream oss_sourceColorLut;
  uint auStack_480 [88];
  ostringstream oss_targetColorLut;
  uint auStack_308 [88];
  ostringstream oss_weight;
  undefined8 local_1a0 [46];
  
  PointerToHexString<XrPassthroughColorMapInterpolatedLutMETA>
            ((XrPassthroughColorMapInterpolatedLutMETA *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_sourceColorLut);
  std::__cxx11::string::~string((string *)&oss_sourceColorLut);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_sourceColorLut,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_sourceColorLut);
    std::__cxx11::string::~string((string *)&oss_sourceColorLut);
  }
  else {
    auStack_480[6] = 0;
    auStack_480[7] = 0;
    auStack_480[8] = 0;
    auStack_480[9] = 0;
    auStack_480[2] = 0;
    auStack_480[3] = 0;
    auStack_480[4] = 0;
    auStack_480[5] = 0;
    auStack_480[0] = 0;
    auStack_480[1] = 0;
    _oss_sourceColorLut = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_sourceColorLut);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_sourceColorLut);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_4b8,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_4b8,contents);
  std::__cxx11::string::~string((string *)&local_4b8);
  if (bVar2) {
    std::__cxx11::string::string((string *)&sourcecolorlut_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&sourcecolorlut_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_sourceColorLut);
    *(uint *)((long)auStack_480 + *(long *)(_oss_sourceColorLut + -0x18)) =
         *(uint *)((long)auStack_480 + *(long *)(_oss_sourceColorLut + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_sourceColorLut);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[26],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [26])"XrPassthroughColorLutMETA",&sourcecolorlut_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_targetColorLut);
    std::__cxx11::string::~string((string *)&oss_targetColorLut);
    std::__cxx11::string::string((string *)&targetcolorlut_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&targetcolorlut_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_targetColorLut);
    *(uint *)((long)auStack_308 + *(long *)(_oss_targetColorLut + -0x18)) =
         *(uint *)((long)auStack_308 + *(long *)(_oss_targetColorLut + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_targetColorLut);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[26],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [26])"XrPassthroughColorLutMETA",&targetcolorlut_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_weight);
    std::__cxx11::string::~string((string *)&oss_weight);
    std::__cxx11::string::string((string *)&weight_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&weight_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_weight);
    *(undefined8 *)((long)local_1a0 + *(long *)(_oss_weight + -0x18)) = 0x20;
    std::ostream::operator<<((ostream *)&oss_weight,value->weight);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&weight_prefix,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_weight);
    std::__cxx11::string::~string((string *)&weight_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_targetColorLut);
    std::__cxx11::string::~string((string *)&targetcolorlut_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_sourceColorLut);
    std::__cxx11::string::~string((string *)&sourcecolorlut_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPassthroughColorMapInterpolatedLutMETA* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string sourcecolorlut_prefix = prefix;
        sourcecolorlut_prefix += "sourceColorLut";
        std::ostringstream oss_sourceColorLut;
        oss_sourceColorLut << std::hex << reinterpret_cast<const void*>(value->sourceColorLut);
        contents.emplace_back("XrPassthroughColorLutMETA", sourcecolorlut_prefix, oss_sourceColorLut.str());
        std::string targetcolorlut_prefix = prefix;
        targetcolorlut_prefix += "targetColorLut";
        std::ostringstream oss_targetColorLut;
        oss_targetColorLut << std::hex << reinterpret_cast<const void*>(value->targetColorLut);
        contents.emplace_back("XrPassthroughColorLutMETA", targetcolorlut_prefix, oss_targetColorLut.str());
        std::string weight_prefix = prefix;
        weight_prefix += "weight";
        std::ostringstream oss_weight;
        oss_weight << std::setprecision(32) << (value->weight);
        contents.emplace_back("float", weight_prefix, oss_weight.str());
        return true;
    } catch(...) {
    }
    return false;
}